

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O1

void Abc_ObjPrint(FILE *pFile,Abc_Obj_t *pObj)

{
  size_t __size;
  char *__format;
  char *pcVar1;
  long lVar2;
  
  fprintf((FILE *)pFile,"Object %5d : ",(ulong)(uint)pObj->Id);
  switch(*(uint *)&pObj->field_0x14 & 0xf) {
  case 0:
    pcVar1 = "NONE   ";
    break;
  case 1:
    pcVar1 = "Const1 ";
    break;
  case 2:
    pcVar1 = "PI     ";
    break;
  case 3:
    pcVar1 = "PO     ";
    break;
  case 4:
    pcVar1 = "BI     ";
    break;
  case 5:
    pcVar1 = "BO     ";
    break;
  case 6:
    pcVar1 = "Net    ";
    break;
  case 7:
    pcVar1 = "Node   ";
    break;
  case 8:
    pcVar1 = "Latch  ";
    break;
  case 9:
    pcVar1 = "Whitebox";
    goto LAB_002f2220;
  case 10:
    pcVar1 = "Blackbox";
LAB_002f2220:
    __size = 8;
    goto LAB_002f2233;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcPrint.c"
                  ,0x64b,"void Abc_ObjPrint(FILE *, Abc_Obj_t *)");
  }
  __size = 7;
LAB_002f2233:
  fwrite(pcVar1,__size,1,(FILE *)pFile);
  fwrite(" Fanins ( ",10,1,(FILE *)pFile);
  if (0 < (pObj->vFanins).nSize) {
    lVar2 = 0;
    do {
      fprintf((FILE *)pFile,"%d ",
              (ulong)*(uint *)((long)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar2]] + 0x10
                              ));
      lVar2 = lVar2 + 1;
    } while (lVar2 < (pObj->vFanins).nSize);
  }
  fwrite(") ",2,1,(FILE *)pFile);
  if ((*(uint *)&pObj->field_0x14 & 0xf) == 7) {
    if ((pObj->pNtk->ntkFunc == ABC_FUNC_SOP) && (pObj->pNtk->ntkType == ABC_NTK_LOGIC)) {
      pcVar1 = (char *)(pObj->field_5).pData;
      __format = " %s";
    }
    else {
      if ((pObj->pNtk->ntkFunc != ABC_FUNC_MAP) || (pObj->pNtk->ntkType != ABC_NTK_LOGIC))
      goto LAB_002f231b;
      pcVar1 = Mio_GateReadName((Mio_Gate_t *)(pObj->field_5).pData);
      __format = " %s\n";
    }
    fprintf((FILE *)pFile,__format,pcVar1);
    return;
  }
LAB_002f231b:
  fputc(10,(FILE *)pFile);
  return;
}

Assistant:

void Abc_ObjPrint( FILE * pFile, Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanin;
    int i;
    fprintf( pFile, "Object %5d : ", pObj->Id );
    switch ( pObj->Type )
    {
        case ABC_OBJ_NONE:
            fprintf( pFile, "NONE   " );
            break;
        case ABC_OBJ_CONST1:
            fprintf( pFile, "Const1 " );
            break;
        case ABC_OBJ_PI:
            fprintf( pFile, "PI     " );
            break;
        case ABC_OBJ_PO:
            fprintf( pFile, "PO     " );
            break;
        case ABC_OBJ_BI:
            fprintf( pFile, "BI     " );
            break;
        case ABC_OBJ_BO:
            fprintf( pFile, "BO     " );
            break;
        case ABC_OBJ_NET:
            fprintf( pFile, "Net    " );
            break;
        case ABC_OBJ_NODE:
            fprintf( pFile, "Node   " );
            break;
        case ABC_OBJ_LATCH:
            fprintf( pFile, "Latch  " );
            break;
        case ABC_OBJ_WHITEBOX:
            fprintf( pFile, "Whitebox" );
            break;
        case ABC_OBJ_BLACKBOX:
            fprintf( pFile, "Blackbox" );
            break;
        default:
            assert(0);
            break;
    }
    // print the fanins
    fprintf( pFile, " Fanins ( " );
    Abc_ObjForEachFanin( pObj, pFanin, i )
        fprintf( pFile, "%d ", pFanin->Id );
    fprintf( pFile, ") " );
/*
    fprintf( pFile, " Fanouts ( " );
    Abc_ObjForEachFanout( pObj, pFanin, i )
        fprintf( pFile, "%d(%c) ", pFanin->Id, Abc_NodeIsTravIdCurrent(pFanin)? '+' : '-' );
    fprintf( pFile, ") " );
*/
    // print the logic function
    if ( Abc_ObjIsNode(pObj) && Abc_NtkIsSopLogic(pObj->pNtk) )
        fprintf( pFile, " %s", (char*)pObj->pData );
    else if ( Abc_ObjIsNode(pObj) && Abc_NtkIsMappedLogic(pObj->pNtk) )
        fprintf( pFile, " %s\n", Mio_GateReadName((Mio_Gate_t *)pObj->pData) );
    else
        fprintf( pFile, "\n" );
}